

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_nullddi.cpp
# Opt level: O2

ze_result_t
driver::zeMemAllocHost
          (ze_context_handle_t hContext,ze_host_mem_alloc_desc_t *host_desc,size_t size,
          size_t alignment,void **pptr)

{
  ze_result_t zVar1;
  
  if (DAT_0010d4c0 != (code *)0x0) {
    zVar1 = (*DAT_0010d4c0)();
    return zVar1;
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zeMemAllocHost(
        ze_context_handle_t hContext,                   ///< [in] handle of the context object
        const ze_host_mem_alloc_desc_t* host_desc,      ///< [in] pointer to host memory allocation descriptor
        size_t size,                                    ///< [in] size in bytes to allocate; must be less than or equal to the
                                                        ///< `maxMemAllocSize` member of ::ze_device_properties_t
        size_t alignment,                               ///< [in] minimum alignment in bytes for the allocation; must be a power of
                                                        ///< two
        void** pptr                                     ///< [out] pointer to host allocation
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnAllocHost = context.zeDdiTable.Mem.pfnAllocHost;
        if( nullptr != pfnAllocHost )
        {
            result = pfnAllocHost( hContext, host_desc, size, alignment, pptr );
        }
        else
        {
            // generic implementation
        }

        return result;
    }